

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool plutosvg_document_extents(plutosvg_document_t *document,char *id,plutovg_rect_t *extents)

{
  undefined1 local_d0 [8];
  render_context_t context;
  element_t *element;
  string_t name;
  undefined1 local_70 [8];
  render_state_t state;
  plutovg_rect_t *extents_local;
  char *id_local;
  plutosvg_document_t *document_local;
  
  local_70 = (undefined1  [8])0x0;
  state.element._0_4_ = 2;
  state.element._4_4_ = 0x3f800000;
  name.length._0_4_ = 0;
  name.length._4_4_ = 0;
  state.matrix.e = 0.0;
  state.matrix.f = 0.0;
  state.extents.x = -1.0;
  state.extents.y = -1.0;
  state.mode = (render_mode_t)document->width;
  state.opacity = document->height;
  state.extents._8_8_ = extents;
  plutovg_matrix_init_identity((plutovg_matrix_t *)&state.view_width);
  if (id == (char *)0x0) {
    state.parent = (render_state *)document->root_element;
  }
  else {
    element = (element_t *)id;
    name.data = (char *)strlen(id);
    state.parent = (render_state *)find_element(document,(string_t *)&element);
    if (state.parent == (render_state *)0x0) {
      *(undefined8 *)state.extents._8_8_ = 0;
      *(undefined8 *)(state.extents._8_8_ + 8) = 0;
      return false;
    }
  }
  memset(local_d0,0,0x28);
  local_d0 = (undefined1  [8])document;
  render_element((element_t *)state.parent,(render_context_t *)local_d0,(render_state_t *)local_70);
  if ((state.extents.x < 0.0) || (state.extents.y < 0.0)) {
    *(undefined8 *)state.extents._8_8_ = 0;
    *(undefined8 *)(state.extents._8_8_ + 8) = 0;
  }
  else {
    *(undefined8 *)state.extents._8_8_ = state.matrix._16_8_;
    *(undefined8 *)(state.extents._8_8_ + 8) = state.extents._0_8_;
  }
  return true;
}

Assistant:

bool plutosvg_document_extents(const plutosvg_document_t* document, const char* id, plutovg_rect_t* extents)
{
    render_state_t state;
    state.parent = NULL;
    state.mode = render_mode_bounding;
    state.opacity = 1.f;
    state.extents = INVALID_RECT;
    state.view_width = document->width;
    state.view_height = document->height;
    plutovg_matrix_init_identity(&state.matrix);
    if(id == NULL) {
        state.element = document->root_element;
    } else {
        const string_t name = {id, strlen(id)};
        const element_t* element = find_element(document, &name);
        if(element == NULL) {
            *extents = EMPTY_RECT;
            return false;
        }

        state.element = element;
    }

    render_context_t context = {document, NULL, NULL, NULL, NULL};
    render_element(state.element, &context, &state);
    if(IS_INVALID_RECT(state.extents)) {
        *extents = EMPTY_RECT;
    } else {
        *extents = state.extents;
    }

    return true;
}